

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O1

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMeshVertexColors(CXMeshFileLoader *this,SXMesh *mesh)

{
  pointer pSVar1;
  bool bVar2;
  u32 uVar3;
  u32 uVar4;
  uint uVar5;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  string<char> local_50;
  
  bVar2 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar2) {
    mesh->HasVertexColors = true;
    for (uVar3 = readInt(this); uVar3 != 0; uVar3 = uVar3 - 1) {
      uVar4 = readInt(this);
      pSVar1 = (mesh->Vertices).m_data.
               super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (int)((ulong)((long)(mesh->Vertices).m_data.
                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 2) *
              0x38e38e39;
      if (uVar4 < uVar5) {
        readRGBA(this,&pSVar1[uVar4].Color);
        checkForOneFollowingSemicolons(this);
      }
      else {
        os::Printer::log((Printer *)"index value in parseDataObjectMeshVertexColors out of bounds",
                         __x_00);
        core::string<char>::string(&local_50,this->Line);
        os::Printer::log(__x_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
          operator_delete(local_50.str._M_dataplus._M_p,
                          local_50.str.field_2._M_allocated_capacity + 1);
        }
        this->ErrorState = true;
      }
      if (uVar5 <= uVar4) {
        return false;
      }
    }
    bVar2 = checkForOneFollowingSemicolons(this);
    if (!bVar2) {
      os::Printer::log((Printer *)
                       "No finishing semicolon in Mesh Vertex Colors Array found in x file",__x_02);
      core::string<char>::string(&local_50,this->Line);
      os::Printer::log(__x_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
        operator_delete(local_50.str._M_dataplus._M_p,local_50.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    bVar2 = checkForClosingBrace(this);
    if (bVar2) {
      return true;
    }
    os::Printer::log((Printer *)"No closing brace in Mesh Texture Coordinates Array found in x file"
                     ,__x_04);
    core::string<char>::string(&local_50,this->Line);
    os::Printer::log(__x_05);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p,local_50.str.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace for Mesh Vertex Colors found in x file",__x);
    core::string<char>::string(&local_50,this->Line);
    os::Printer::log(__x_06);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
      operator_delete(local_50.str._M_dataplus._M_p,local_50.str.field_2._M_allocated_capacity + 1);
    }
    this->ErrorState = true;
  }
  return false;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMeshVertexColors(SXMesh &mesh)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading mesh vertex colors", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace for Mesh Vertex Colors found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	mesh.HasVertexColors = true;
	const u32 nColors = readInt();
	for (u32 i = 0; i < nColors; ++i) {
		const u32 Index = readInt();
		if (Index >= mesh.Vertices.size()) {
			os::Printer::log("index value in parseDataObjectMeshVertexColors out of bounds", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		}
		readRGBA(mesh.Vertices[Index].Color);
		checkForOneFollowingSemicolons();
	}

	if (!checkForOneFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Vertex Colors Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Mesh Texture Coordinates Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		return false;
	}

	return true;
}